

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O2

void __thiscall mjs::global_object_impl::popuplate_global(global_object_impl *this)

{
  gc_heap *args;
  bool bVar1;
  version vVar2;
  gc_heap_ptr_untyped *pgVar3;
  undefined8 *puVar4;
  object_ptr *poVar5;
  object *this_00;
  uint *puVar6;
  ulong uVar7;
  gc_heap_ptr<mjs::function_object> throw_func;
  value eo;
  anon_class_8_1_89917c4a put_string_function;
  gc_heap_ptr<mjs::global_object> self;
  anon_class_8_1_8991fb9c add;
  gc_heap_ptr_untyped local_1d8;
  gc_heap_ptr_untyped local_1c8;
  gc_heap_ptr_untyped local_1b8;
  wostringstream woss;
  anon_union_32_5_7b1e0779_for_value_3 local_1a0 [11];
  
  object::prototype((object *)&woss);
  (this->object_prototype_).pos_ = local_1a0[0]._0_4_;
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&woss);
  args = (this->super_global_object).super_object.heap_;
  self_ptr((global_object_impl *)&self);
  (*(this->super_global_object).super_object._vptr_object[0x13])(&throw_func,this,"Function");
  (*(this->super_global_object).super_object._vptr_object[0xb])(&local_1d8,this);
  gc_heap::
  make<mjs::function_object,mjs::gc_heap_ptr<mjs::global_object>,mjs::string,mjs::gc_heap_ptr<mjs::object>>
            ((gc_heap *)&eo,(gc_heap_ptr<mjs::global_object> *)args,(string *)&self,
             (gc_heap_ptr<mjs::object> *)&throw_func);
  gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&woss,(gc_heap_ptr_untyped *)&eo);
  (this->function_prototype_).pos_ = local_1a0[0]._0_4_;
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&woss);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&eo);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_1d8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&throw_func.super_gc_heap_ptr_untyped);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&self.super_gc_heap_ptr_untyped);
  add.this = this;
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)&add,
             "Object",make_object_object,&this->object_prototype_);
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)&add,
             "Function",make_function_object,&this->function_prototype_);
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)&add,
             "Array",make_array_object,&this->array_prototype_);
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)&add,
             "String",make_string_object,&this->string_prototype_);
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)&add,
             "Boolean",make_boolean_object,&this->boolean_prototype_);
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)&add,
             "Number",make_number_object,&this->number_prototype_);
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)&add,
             "Math",anon_unknown_35::make_math_object,
             (gc_heap_ptr_untracked<mjs::object,_true> *)0x0);
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)&add,
             "Date",make_date_object,(gc_heap_ptr_untracked<mjs::object,_true> *)0x0);
  popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}::
  operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)&add,
             "console",anon_unknown_35::make_console_object,
             (gc_heap_ptr_untracked<mjs::object,_true> *)0x0);
  vVar2 = (this->super_global_object).version_;
  if (1 < (int)vVar2) {
    popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}
    ::operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
                 &add,"JSON",make_json_object,(gc_heap_ptr_untracked<mjs::object,_true> *)0x0);
    vVar2 = (this->super_global_object).version_;
  }
  if (0 < (int)vVar2) {
    popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}
    ::operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
                 &add,"RegExp",make_regexp_object,&this->regexp_prototype_);
    popuplate_global()::{lambda(char_const*,auto:1,mjs::gc_heap_ptr_untracked<mjs::object,true>*)#1}
    ::operator()((_lambda_char_const__auto_1_mjs__gc_heap_ptr_untracked<mjs::object,true>___1_ *)
                 &add,"Error",make_error_object,(gc_heap_ptr_untracked<mjs::object,_true> *)0x0);
    puVar6 = &native_error_types;
    for (uVar7 = 0; uVar7 != 8; uVar7 = uVar7 + 1) {
      if (uVar7 != *puVar6) {
        __assert_fail("native_error_types[i] == static_cast<native_error_type>(i)",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                      ,0x298,"void mjs::global_object_impl::popuplate_global()");
      }
      std::__cxx11::wostringstream::wostringstream((wostringstream *)&woss);
      mjs::operator<<((wostream *)&woss,(native_error_type)uVar7);
      std::__cxx11::wstringbuf::str();
      throw_func.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)self.super_gc_heap_ptr_untyped._8_8_;
      throw_func.super_gc_heap_ptr_untyped._8_8_ = self.super_gc_heap_ptr_untyped.heap_;
      (**(this->super_global_object).super_object._vptr_object)(&eo,this,&throw_func);
      std::__cxx11::wstring::~wstring((wstring *)&self);
      bVar1 = is_function(&eo);
      if (!bVar1) {
        __assert_fail("is_function(eo)",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                      ,0x29c,"void mjs::global_object_impl::popuplate_global()");
      }
      pgVar3 = &value::object_value(&eo)->super_gc_heap_ptr_untyped;
      puVar4 = (undefined8 *)gc_heap_ptr_untyped::get(pgVar3);
      throw_func.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)0x9;
      throw_func.super_gc_heap_ptr_untyped._8_8_ = L"prototype";
      (**(code **)*puVar4)((value *)&self,puVar4,&throw_func);
      if ((int)self.super_gc_heap_ptr_untyped.heap_ != 5) {
        __assert_fail("prototype.type() == value_type::object",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                      ,0x29e,"void mjs::global_object_impl::popuplate_global()");
      }
      poVar5 = value::object_value((value *)&self);
      this->error_prototype_[uVar7].pos_ = (poVar5->super_gc_heap_ptr_untyped).pos_;
      value::~value((value *)&self);
      value::~value(&eo);
      std::__cxx11::wostringstream::~wostringstream((wostringstream *)&woss);
      puVar6 = puVar6 + 1;
    }
  }
  eo.type_ = reference;
  eo._4_4_ = 0;
  eo.field_1.n_ = (double)anon_var_dwarf_d2821;
  (**(this->super_global_object).super_object._vptr_object)((value *)&woss,this);
  pgVar3 = &value::object_value((value *)&woss)->super_gc_heap_ptr_untyped;
  this_00 = (object *)gc_heap_ptr_untyped::get(pgVar3);
  self.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)0x9;
  self.super_gc_heap_ptr_untyped._8_8_ = L"prototype";
  bVar1 = object::can_put(this_00,(wstring_view *)&self);
  if (!bVar1) {
    value::~value((value *)&woss);
    self_ptr((global_object_impl *)&self);
    vVar2 = (this->super_global_object).version_;
    uVar7 = 2;
    if (0 < (int)vVar2) {
      uVar7 = (ulong)(7 - (vVar2 < es5));
    }
    throw_func.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)0x3;
    throw_func.super_gc_heap_ptr_untyped._8_8_ = (long)"isNaN" + 2;
    string::string((string *)&eo,(this->super_global_object).super_object.heap_,
                   (string_view *)&throw_func);
    _woss = number;
    (*(this->super_global_object).super_object._vptr_object[1])(this,&eo,&woss,uVar7);
    value::~value((value *)&woss);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&eo);
    throw_func.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)0x8;
    throw_func.super_gc_heap_ptr_untyped._8_8_ = anon_var_dwarf_d286f;
    string::string((string *)&eo,(this->super_global_object).super_object.heap_,
                   (string_view *)&throw_func);
    _woss = number;
    (*(this->super_global_object).super_object._vptr_object[1])(this,&eo,&woss,uVar7);
    value::~value((value *)&woss);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&eo);
    throw_func.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)0x9;
    throw_func.super_gc_heap_ptr_untyped._8_8_ =
         (long)"get.type() != value_type::undefined || set.type() != value_type::undefined" + 0x41;
    string::string((string *)&eo,(this->super_global_object).super_object.heap_,
                   (string_view *)&throw_func);
    value::value((value *)&woss,(value *)&value::undefined);
    (*(this->super_global_object).super_object._vptr_object[1])(this,&eo,&woss,uVar7);
    value::~value((value *)&woss);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&eo);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&woss,&self.super_gc_heap_ptr_untyped);
    eo._0_8_ = (this->super_global_object).super_object.heap_;
    eo.field_1._0_4_ = (this->super_global_object).version_;
    put_native_function<mjs::global_object_impl::popuplate_global()::_lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)_1_>
              (&self,(object_ptr *)&woss,"parseInt",(anon_class_16_2_fa5da7e4_for_f *)&eo,2);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&woss);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&woss,&self.super_gc_heap_ptr_untyped);
    put_native_function<mjs::global_object_impl::popuplate_global()::_lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)_2_>
              (&self,(object_ptr *)&woss,"isNaN",(anon_class_1_0_00000001_for_f *)&eo,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&woss);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&woss,&self.super_gc_heap_ptr_untyped);
    put_native_function<mjs::global_object_impl::popuplate_global()::_lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)_3_>
              (&self,(object_ptr *)&woss,"isFinite",(anon_class_1_0_00000001_for_f *)&eo,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&woss);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              ((gc_heap_ptr_untyped *)&woss,&self.super_gc_heap_ptr_untyped);
    eo._0_8_ = (this->super_global_object).super_object.heap_;
    put_native_function<mjs::global_object_impl::popuplate_global()::_lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)_4_>
              (&self,(object_ptr *)&woss,"alert",(anon_class_8_1_54a39808_for_f *)&eo,1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&woss);
    put_string_function.self = &self;
    popuplate_global()::{lambda(char_const*,auto:1)#1}::operator()
              (&put_string_function,"parseFloat",anon_unknown_35::parse_float);
    popuplate_global()::{lambda(char_const*,auto:1)#1}::operator()
              (&put_string_function,"escape",anon_unknown_35::escape);
    popuplate_global()::{lambda(char_const*,auto:1)#1}::operator()
              (&put_string_function,"unescape",anon_unknown_35::unescape);
    if (0 < (int)(this->super_global_object).version_) {
      popuplate_global()::{lambda(char_const*,auto:1)#1}::operator()
                (&put_string_function,"encodeURI",anon_unknown_35::encode_uri);
      popuplate_global()::{lambda(char_const*,auto:1)#1}::operator()
                (&put_string_function,"encodeURIComponent",anon_unknown_35::encode_uri_component);
      popuplate_global()::{lambda(char_const*,auto:1)#1}::operator()
                (&put_string_function,"decodeURI",anon_unknown_35::decode_uri);
      popuplate_global()::{lambda(char_const*,auto:1)#1}::operator()
                (&put_string_function,"decodeURIComponent",anon_unknown_35::decode_uri_component);
      if (1 < (int)(this->super_global_object).version_) {
        gc_heap_ptr_untyped::gc_heap_ptr_untyped
                  ((gc_heap_ptr_untyped *)&woss,&self.super_gc_heap_ptr_untyped);
        (*(this->super_global_object).super_object._vptr_object[0x13])(&eo,this,"");
        make_function<mjs::global_object_impl::popuplate_global()::_lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)_5_>
                  ((mjs *)&throw_func,&self,(anon_class_16_1_570cf4e1_for_f *)&woss,
                   (gc_heap_ptr<mjs::gc_string> *)&eo,0);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&eo);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&woss);
        gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_1b8,&throw_func.super_gc_heap_ptr_untyped);
        value::value((value *)&woss,(object_ptr *)&local_1b8);
        gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_1c8,&throw_func.super_gc_heap_ptr_untyped);
        value::value(&eo,(object_ptr *)&local_1c8);
        make_accessor_object((mjs *)&local_1d8,&self,(value *)&woss,&eo);
        (this->thrower_).pos_ = local_1d8.pos_;
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_1d8);
        value::~value(&eo);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_1c8);
        value::~value((value *)&woss);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_1b8);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&throw_func.super_gc_heap_ptr_untyped);
      }
    }
    (*(this->super_global_object).super_object._vptr_object[0x13])(&eo,this,"global");
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              (&throw_func.super_gc_heap_ptr_untyped,&self.super_gc_heap_ptr_untyped);
    value::value((value *)&woss,(object_ptr *)&throw_func);
    (*(this->super_global_object).super_object._vptr_object[1])(this,&eo,&woss,5);
    value::~value((value *)&woss);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&throw_func.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&eo);
    (*(this->super_global_object).super_object._vptr_object[0x13])(&eo,this,"this");
    gc_heap_ptr_untyped::gc_heap_ptr_untyped
              (&throw_func.super_gc_heap_ptr_untyped,&self.super_gc_heap_ptr_untyped);
    value::value((value *)&woss,(object_ptr *)&throw_func);
    (*(this->super_global_object).super_object._vptr_object[1])(this,&eo,&woss,7);
    value::~value((value *)&woss);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&throw_func.super_gc_heap_ptr_untyped);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&eo);
    (*(this->super_global_object).super_object._vptr_object[0x13])(&eo,this,"length");
    _woss = number;
    (*(this->super_global_object).super_object._vptr_object[1])(this,&eo,&woss,7);
    value::~value((value *)&woss);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&eo);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&self.super_gc_heap_ptr_untyped);
    return;
  }
  __assert_fail("!get(L\"Object\").object_value()->can_put(L\"prototype\")",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                ,0x2a3,"void mjs::global_object_impl::popuplate_global()");
}

Assistant:

void popuplate_global() {
        // The object and function prototypes are special
        object_prototype_   = prototype(); // This way the global object will have the same functions as a normal object
        function_prototype_ = static_cast<object_ptr>(heap().make<function_object>(self_ptr(), common_string("Function"), object_prototype()));
         
        auto add = [&](const char* name, auto create_func, gc_heap_ptr_untracked<object>* prototype = nullptr) {
            auto res = create_func(self_ptr());
            put(common_string(name), value{res.obj}, default_attributes);
            if (res.prototype) {
                assert(res.obj.template has_type<function_object>());
                auto& f = static_cast<function_object&>(*res.obj);
                f.put_prototype_with_attributes(res.prototype, prototype_attributes);
            }
            if (prototype) {
                assert(res.prototype);
                *prototype = res.prototype;
            }
        };

        // §15.1
        add("Object", make_object_object, &object_prototype_);          // Resetting it..
        add("Function", make_function_object, &function_prototype_);    // same
        add("Array", make_array_object, &array_prototype_);
        add("String", make_string_object, &string_prototype_);
        add("Boolean", make_boolean_object, &boolean_prototype_);
        add("Number", make_number_object, &number_prototype_);
        add("Math", make_math_object);
        add("Date", make_date_object);
        add("console", make_console_object);
        if (version_ >= version::es5) {
            add("JSON", make_json_object);
        }

        if (language_version() >= version::es3) {
            add("RegExp", make_regexp_object, &regexp_prototype_);
            add("Error", make_error_object);

            // Grab error protototypes before the user can corrupt them
            for (uint32_t i = 0; i < num_native_error_types; ++i) {
                assert(native_error_types[i] == static_cast<native_error_type>(i));
                std::wostringstream woss;
                woss << static_cast<native_error_type>(i);
                auto eo = get(woss.str());
                assert(is_function(eo));
                auto prototype = eo.object_value()->get(L"prototype");
                assert(prototype.type() == value_type::object);
                error_prototype_[i] = prototype.object_value();
            }
        }

        assert(!get(L"Object").object_value()->can_put(L"prototype"));

        auto self = self_ptr();

        auto global_const_attrs = default_attributes;
        if (version_ >= version::es3) {
            global_const_attrs |= property_attribute::dont_delete;
        }
        if (version_ >= version::es5) {
            global_const_attrs |= property_attribute::read_only;
        }

        put(string{heap(), "NaN"}, value{NAN}, global_const_attrs);
        put(string{heap(), "Infinity"}, value{INFINITY}, global_const_attrs);
        put(string{heap(), "undefined"}, value{value::undefined}, global_const_attrs);

        // Note: eval is added by the interpreter

        put_native_function(self, self, "parseInt", [&h=heap(), ver=version_](const value&, const std::vector<value>& args) {
            const auto input = to_string(h, get_arg(args, 0));
            int radix = to_int32(get_arg(args, 1));
            return value{parse_int(input.view(), radix, ver)};
        }, 2);
        put_native_function(self, self, "isNaN", [](const value&, const std::vector<value>& args) {
            return value(std::isnan(to_number(args.empty() ? value::undefined : args.front())));
        }, 1);
        put_native_function(self, self, "isFinite", [](const value&, const std::vector<value>& args) {
            return value(std::isfinite(to_number(args.empty() ? value::undefined : args.front())));
        }, 1);
        put_native_function(self, self, "alert", [&h=heap()](const value&, const std::vector<value>& args) {
            std::wcout << "ALERT";
            for (auto& a: args) {
                std::wcout << "\t" << to_string(h, a);
            }
            std::wcout << "\n";
            return value::undefined;
        }, 1);

        auto put_string_function = [&](const char* name, auto f) {
            put_native_function(self, self, name, [self, f](const value&, const std::vector<value>& args) {
                const auto input = to_string(self.heap(), get_arg(args, 0));
                return f(self, input.view());
            }, 1);
        };

        put_string_function("parseFloat", &parse_float);
        put_string_function("escape", &escape);
        put_string_function("unescape", &unescape);

        if (version_ >= version::es3) {
            put_string_function("encodeURI", &encode_uri);
            put_string_function("encodeURIComponent", &encode_uri_component);
            put_string_function("decodeURI", &decode_uri);
            put_string_function("decodeURIComponent", &decode_uri_component);
        }

        if (version_ >= version::es5) {
            // ES5.1, 13.2.3 [[ThrowTypeError]]
            auto throw_func = make_function(self, [global = self](const value&, const std::vector<value>&) -> value {
                // For now only strict mode code uses this...
                throw native_error_exception{native_error_type::type, global->stack_trace(), "Property may not be accessed in strict mode"};
            }, common_string("").unsafe_raw_get(), 0);
            thrower_ = make_accessor_object(self, value{throw_func}, value{throw_func});

        }

        // Add this class as the global object
        put(common_string("global"), value{self}, property_attribute::dont_delete | property_attribute::read_only);

        put(common_string("this"), value{self}, prototype_attributes);

        // Make ES5 Conformance Suite happy
        put(common_string("length"), value{0.}, prototype_attributes);
    }